

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialog.cpp
# Opt level: O0

void QDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  bool bVar2;
  undefined4 uVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QWidget *in_RDI;
  void *_v_1;
  void *_v;
  int _r;
  QDialog *_t;
  int in_stack_ffffffffffffff8c;
  uint uVar4;
  undefined1 modal;
  QDialog *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 enabled;
  QDialog *in_stack_ffffffffffffffc0;
  
  enabled = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff90 = (QDialog *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff90) {
    case (QDialog *)0x0:
      finished((QDialog *)0x7461fd,in_stack_ffffffffffffff8c);
      break;
    case (QDialog *)0x1:
      accepted((QDialog *)0x74620c);
      break;
    case (QDialog *)0x2:
      rejected((QDialog *)0x74621b);
      break;
    case (QDialog *)0x3:
      (**(code **)(*(long *)in_RDI + 0x1a0))();
      break;
    case (QDialog *)0x4:
      uVar3 = (**(code **)(*(long *)in_RDI + 0x1a8))();
      if (*(long *)in_RCX != 0) {
        **(undefined4 **)in_RCX = uVar3;
      }
      break;
    case (QDialog *)0x5:
      (**(code **)(*(long *)in_RDI + 0x1b0))(in_RDI,**(undefined4 **)(in_RCX + 8));
      break;
    case (QDialog *)0x6:
      (**(code **)(*(long *)in_RDI + 0x1b8))();
      break;
    case (QDialog *)0x7:
      (**(code **)(*(long *)in_RDI + 0x1c0))();
    }
  }
  modal = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
  if (in_ESI == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QDialog::*)(int)>(in_RCX,(void **)finished,0,0);
    if (bVar2) {
      return;
    }
    enabled = 0;
    in_stack_ffffffffffffffc0 = (QDialog *)0x0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QDialog::*)()>(in_RCX,(void **)accepted,0,1);
    if (bVar2) {
      return;
    }
    bVar2 = QtMocHelpers::indexOfMethod<void(QDialog::*)()>(in_RCX,(void **)rejected,0,2);
    if (bVar2) {
      return;
    }
  }
  if (in_ESI == 1) {
    uVar1 = *(undefined8 *)in_RCX;
    uVar4 = in_EDX;
    if (in_EDX == 0) {
      bVar2 = isSizeGripEnabled(in_stack_ffffffffffffff90);
      *(bool *)uVar1 = bVar2;
    }
    else if (in_EDX == 1) {
      bVar2 = QWidget::isModal(in_RDI);
      *(bool *)uVar1 = bVar2;
    }
    modal = (undefined1)(uVar4 >> 0x18);
  }
  if (in_ESI == 2) {
    if (in_EDX == 0) {
      setSizeGripEnabled(in_stack_ffffffffffffffc0,(bool)enabled);
    }
    else if (in_EDX == 1) {
      setModal(in_stack_ffffffffffffff90,(bool)modal);
    }
  }
  return;
}

Assistant:

void QDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->rejected(); break;
        case 3: _t->open(); break;
        case 4: { int _r = _t->exec();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->done((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->accept(); break;
        case 7: _t->reject(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)(int )>(_a, &QDialog::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::rejected, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSizeGripEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSizeGripEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModal(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}